

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O1

uint32_t rgbcx::bc1_find_sels4
                   (uint32_t flags,color32 *pSrc_pixels,uint32_t lr,uint32_t lg,uint32_t lb,
                   uint32_t hr,uint32_t hg,uint32_t hb,uint8_t *sels,uint32_t cur_err)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined4 uVar14;
  int iVar15;
  int iVar16;
  uint32_t i;
  long lVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  uint8_t uVar28;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  ulong uVar32;
  int iVar33;
  uint uVar34;
  int iVar35;
  uint uVar36;
  uint32_t uVar37;
  undefined1 auVar38 [16];
  uint32_t block_b [4];
  uint32_t block_g [4];
  uint32_t block_r [4];
  
  if ((char)flags < '\0') {
    bc1_get_block_colors4(block_r,block_g,block_b,lr,lg,lb,hr,hg,hb);
    uVar8 = block_r[3] - block_r[0];
    uVar29 = block_g[3] - block_g[0];
    uVar34 = block_b[3] - block_b[0];
    auVar7._4_4_ = block_r[1];
    auVar7._8_4_ = block_r[2];
    auVar7._0_4_ = block_r[0];
    auVar7._12_4_ = block_r[3];
    auVar6._4_4_ = block_g[1];
    auVar6._8_4_ = block_g[2];
    auVar6._0_4_ = block_g[0];
    auVar6._12_4_ = block_g[3];
    auVar5._4_4_ = block_b[1];
    auVar5._8_4_ = block_b[2];
    auVar5._0_4_ = block_b[0];
    auVar5._12_4_ = block_b[3];
    uVar37 = (uint32_t)block_b._4_8_;
    auVar38._4_4_ = uVar37;
    auVar38._0_4_ = uVar37;
    auVar38._8_4_ = block_b[3];
    auVar38._12_4_ = block_b[3];
    iVar26 = uVar37 * uVar34 + (uint32_t)block_g._4_8_ * uVar29 + (uint32_t)block_r._4_8_ * uVar8;
    iVar33 = (int)((auVar5._8_8_ & 0xffffffff) * (ulong)uVar34) +
             (int)((auVar6._8_8_ & 0xffffffff) * (ulong)uVar29) +
             (int)((auVar7._8_8_ & 0xffffffff) * (ulong)uVar8);
    iVar24 = block_b[0] * uVar34 + block_g[0] * uVar29 + block_r[0] * uVar8 + iVar26;
    iVar26 = iVar26 + iVar33;
    iVar33 = (int)((auVar38._8_8_ & 0xffffffff) * (ulong)uVar34) +
             block_g[3] * uVar29 + block_r[3] * uVar8 + iVar33;
    iVar10 = uVar8 * 2;
    iVar15 = uVar29 * 2;
    iVar16 = uVar34 * 2;
    uVar32 = 0;
    uVar8 = 0;
    do {
      iVar11 = (uint)pSrc_pixels[uVar32].field_0.field_0.b * iVar16 +
               (uint)pSrc_pixels[uVar32].field_0.field_0.g * iVar15 +
               (uint)pSrc_pixels[uVar32].field_0.field_0.r * iVar10;
      iVar30 = (uint)pSrc_pixels[uVar32 + 1].field_0.field_0.b * iVar16 +
               (uint)pSrc_pixels[uVar32 + 1].field_0.field_0.g * iVar15 +
               (uint)pSrc_pixels[uVar32 + 1].field_0.field_0.r * iVar10;
      iVar35 = (uint)pSrc_pixels[uVar32 + 2].field_0.field_0.b * iVar16 +
               (uint)pSrc_pixels[uVar32 + 2].field_0.field_0.g * iVar15 +
               (uint)pSrc_pixels[uVar32 + 2].field_0.field_0.r * iVar10;
      iVar25 = (uint)pSrc_pixels[uVar32 + 3].field_0.field_0.b * iVar16 +
               (uint)pSrc_pixels[uVar32 + 3].field_0.field_0.g * iVar15 +
               (uint)pSrc_pixels[uVar32 + 3].field_0.field_0.r * iVar10;
      bVar1 = "\x03\x02\x01"
              [(ulong)(iVar11 < iVar33) + (ulong)(iVar11 < iVar26) + (ulong)(iVar11 <= iVar24)];
      bVar2 = "\x03\x02\x01"
              [(ulong)(iVar30 < iVar33) + (ulong)(iVar30 < iVar26) + (ulong)(iVar30 <= iVar24)];
      bVar3 = "\x03\x02\x01"
              [(ulong)(iVar35 < iVar33) + (ulong)(iVar35 < iVar26) + (ulong)(iVar35 <= iVar24)];
      bVar4 = "\x03\x02\x01"
              [(ulong)(iVar25 < iVar33) + (ulong)(iVar25 < iVar26) + (ulong)(iVar25 <= iVar24)];
      sels[uVar32] = bVar1;
      sels[uVar32 + 1] = bVar2;
      sels[uVar32 + 2] = bVar3;
      sels[uVar32 + 3] = bVar4;
      iVar18 = (uint)pSrc_pixels[uVar32].field_0.field_0.r - block_r[bVar1];
      iVar11 = (uint)pSrc_pixels[uVar32].field_0.field_0.g - block_g[bVar1];
      iVar27 = (uint)pSrc_pixels[uVar32].field_0.field_0.b - block_b[bVar1];
      iVar25 = (uint)pSrc_pixels[uVar32 + 1].field_0.field_0.r - block_r[bVar2];
      iVar19 = (uint)pSrc_pixels[uVar32 + 1].field_0.field_0.g - block_g[bVar2];
      iVar30 = (uint)pSrc_pixels[uVar32 + 1].field_0.field_0.b - block_b[bVar2];
      iVar20 = (uint)pSrc_pixels[uVar32 + 2].field_0.field_0.r - block_r[bVar3];
      iVar12 = (uint)pSrc_pixels[uVar32 + 2].field_0.field_0.g - block_g[bVar3];
      iVar21 = (uint)pSrc_pixels[uVar32 + 2].field_0.field_0.b - block_b[bVar3];
      iVar13 = (uint)pSrc_pixels[uVar32 + 3].field_0.field_0.r - block_r[bVar4];
      iVar22 = (uint)pSrc_pixels[uVar32 + 3].field_0.field_0.g - block_g[bVar4];
      iVar35 = (uint)pSrc_pixels[uVar32 + 3].field_0.field_0.b - block_b[bVar4];
      uVar8 = iVar35 * iVar35 + iVar22 * iVar22 +
              iVar13 * iVar13 + iVar21 * iVar21 + iVar12 * iVar12 + iVar20 * iVar20 +
              iVar30 * iVar30 + iVar19 * iVar19 + iVar25 * iVar25 +
              iVar27 * iVar27 + iVar11 * iVar11 + iVar18 * iVar18 + uVar8;
      if (0xb < uVar32) {
        return uVar8;
      }
      uVar32 = uVar32 + 4;
    } while (uVar8 < cur_err);
  }
  else if ((flags >> 8 & 1) == 0) {
    bc1_get_block_colors4(block_r,block_g,block_b,lr,lg,lb,hr,hg,hb);
    iVar10 = block_r[3] - block_r[0];
    iVar15 = block_g[3] - block_g[0];
    iVar16 = block_b[3] - block_b[0];
    lVar17 = 0;
    uVar8 = 0;
    do {
      bVar1 = pSrc_pixels[lVar17].field_0.field_0.r;
      bVar2 = pSrc_pixels[lVar17].field_0.field_0.g;
      bVar3 = pSrc_pixels[lVar17].field_0.field_0.b;
      uVar29 = (uint)((float)(int)((bVar3 - block_b[0]) * iVar16 +
                                  (bVar2 - block_g[0]) * iVar15 + (bVar1 - block_r[0]) * iVar10) *
                      (4.0 / ((float)(iVar16 * iVar16 + iVar15 * iVar15 + iVar10 * iVar10) +
                             1.25e-06)) + 0.5);
      if (2 < (int)uVar29) {
        uVar29 = 3;
      }
      if ((int)uVar29 < 2) {
        uVar29 = 1;
      }
      uVar32 = (ulong)(uVar29 - 1);
      uVar9 = (block_b[uVar32] - (uint)bVar3) * (block_b[uVar32] - (uint)bVar3) +
              (block_g[uVar32] - (uint)bVar2) * (block_g[uVar32] - (uint)bVar2) +
              (block_r[uVar32] - (uint)bVar1) * (block_r[uVar32] - (uint)bVar1);
      iVar26 = block_r[uVar29] - (uint)bVar1;
      iVar24 = block_g[uVar29] - (uint)bVar2;
      iVar33 = block_b[uVar29] - (uint)bVar3;
      uVar34 = iVar33 * iVar33 + iVar24 * iVar24 + iVar26 * iVar26;
      if (uVar9 == uVar34) {
        uVar31 = (ulong)uVar29;
        if (uVar29 - 1 == 0) {
          uVar31 = uVar32;
        }
        uVar28 = (uint8_t)uVar31;
      }
      else {
        uVar31 = (ulong)uVar29;
        if (uVar9 < uVar34) {
          uVar31 = uVar32;
        }
        uVar28 = (uint8_t)uVar31;
        if (uVar9 < uVar34) {
          uVar34 = uVar9;
        }
      }
      uVar8 = uVar8 + uVar34;
      if (cur_err <= uVar8) {
        return uVar8;
      }
      sels[lVar17] = uVar28;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 0x10);
  }
  else {
    bc1_get_block_colors4(block_r,block_g,block_b,lr,lg,lb,hr,hg,hb);
    lVar17 = 0;
    uVar8 = 0;
    do {
      uVar34 = (uint)pSrc_pixels[lVar17].field_0.field_0.r;
      iVar15 = block_r[0] - uVar34;
      uVar9 = (uint)pSrc_pixels[lVar17].field_0.field_0.g;
      iVar10 = block_g[0] - uVar9;
      uVar23 = (uint)pSrc_pixels[lVar17].field_0.field_0.b;
      iVar16 = block_b[0] - uVar23;
      uVar29 = iVar16 * iVar16 + iVar10 * iVar10 + iVar15 * iVar15;
      if (uVar29 == 0) {
        uVar28 = '\0';
      }
      else {
        uVar32 = 1;
        uVar14 = 0;
        do {
          iVar15 = block_r[uVar32] - uVar34;
          iVar10 = block_g[uVar32] - uVar9;
          iVar16 = block_b[uVar32] - uVar23;
          uVar36 = iVar16 * iVar16 + iVar10 * iVar10 + iVar15 * iVar15;
          if ((uVar36 < uVar29) || ((uVar32 == 3 && (uVar36 == uVar29)))) {
            uVar14 = (undefined4)uVar32;
            uVar29 = uVar36;
          }
          uVar28 = (uint8_t)uVar14;
        } while ((uVar32 < 3) && (uVar32 = uVar32 + 1, uVar29 != 0));
      }
      uVar8 = uVar8 + uVar29;
      if (cur_err <= uVar8) {
        return uVar8;
      }
      sels[lVar17] = uVar28;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 0x10);
  }
  return uVar8;
}

Assistant:

static inline uint32_t bc1_find_sels4(uint32_t flags, const color32* pSrc_pixels, uint32_t lr, uint32_t lg, uint32_t lb, uint32_t hr, uint32_t hg, uint32_t hb, uint8_t sels[16], uint32_t cur_err)
	{
		uint32_t err;

		if (flags & cEncodeBC1UseFasterMSEEval)
			err = bc1_find_sels4_fasterr(pSrc_pixels, lr, lg, lb, hr, hg, hb, sels, cur_err);
		else if (flags & cEncodeBC1UseFullMSEEval)
			err = bc1_find_sels4_fullerr(pSrc_pixels, lr, lg, lb, hr, hg, hb, sels, cur_err);
		else
			err = bc1_find_sels4_check2_err(pSrc_pixels, lr, lg, lb, hr, hg, hb, sels, cur_err);

		return err;
	}